

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR moveto_op_comp_item(lyxp_set *set1,uint32_t idx1,lyxp_set *set2,char *op,
                          ly_bool switch_operands,ly_bool *result)

{
  lysc_node *plVar1;
  lys_module *plVar2;
  code *pcVar3;
  LY_ERR LVar4;
  int iVar5;
  lyxp_set_node *plVar6;
  lysc_node **pplVar7;
  size_t sVar8;
  char *pcVar9;
  lyxp_set_type type;
  lyxp_set *set2_00;
  lyxp_set *set1_00;
  lyd_node *plVar10;
  void *local_108;
  ly_ctx *local_100;
  lys_module *local_f8;
  lyd_value val;
  lyxp_set tmp1;
  
  memset(&tmp1,0,0x90);
  if (set1->type != LYXP_SET_NODE_SET) {
    __assert_fail("set1->type == LYXP_SET_NODE_SET",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x1c5c,
                  "LY_ERR moveto_op_comp_item(const struct lyxp_set *, uint32_t, struct lyxp_set *, const char *, ly_bool, ly_bool *)"
                 );
  }
  type = (uint)(set2->type != LYXP_SET_BOOLEAN) * 2 + LYXP_SET_BOOLEAN;
  if (set2->type == LYXP_SET_NUMBER) {
    type = LYXP_SET_NUMBER;
  }
  LVar4 = set_comp_cast(&tmp1,set1,type,idx1);
  if (LVar4 != LY_SUCCESS) goto LAB_001a9fca;
  plVar6 = (set1->val).nodes + idx1;
  local_108 = (void *)0x0;
  if (set2->type == LYXP_SET_STRING) {
    if (plVar6->type == LYXP_NODE_META) {
      plVar10 = plVar6->node;
      pplVar7 = (lysc_node **)&plVar10->meta;
LAB_001a9eaa:
      plVar1 = *pplVar7;
      if (plVar1 != (lysc_node *)0x0) {
        iVar5 = *(int *)&plVar1->next;
        plVar2 = plVar1->parent->module;
        if (iVar5 == 0xb) {
          pcVar3 = lyplg_type_store_enum;
joined_r0x001a9ee8:
          if (plVar2 == (lys_module *)pcVar3) goto LAB_001a9fa4;
        }
        else {
          if (iVar5 == 8) {
            pcVar3 = lyplg_type_store_boolean;
            goto joined_r0x001a9ee8;
          }
          if (iVar5 == 6) {
            pcVar3 = lyplg_type_store_string;
            goto joined_r0x001a9ee8;
          }
        }
        pcVar9 = (set2->val).str;
        local_100 = set2->ctx;
        local_f8 = plVar2;
        sVar8 = strlen(pcVar9);
        iVar5 = (*(code *)local_f8)(local_100,plVar1,pcVar9,sVar8,0,set2->format,set2->prefix_data,
                                    0x3f3,plVar10->schema,&val,0,&local_108);
        ly_err_free(local_108);
        if ((iVar5 == 9) || (iVar5 == 0)) {
          free((set2->val).nodes);
          pcVar9 = lyd_value_get_canonical(set2->ctx,&val);
          pcVar9 = strdup(pcVar9);
          (set2->val).str = pcVar9;
          (*(code *)plVar1->parent->ref)(set2->ctx);
          if ((set2->val).nodes == (lyxp_set_node *)0x0) {
            LVar4 = LY_EMEM;
            ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_comp_canonize"
                  );
            goto LAB_001a9fca;
          }
        }
      }
    }
    else if (plVar6->type == LYXP_NODE_ELEM) {
      plVar10 = plVar6->node;
      if ((plVar10->schema != (lysc_node *)0x0) && ((plVar10->schema->nodetype & 0xc) != 0)) {
        pplVar7 = &plVar10[1].schema;
        goto LAB_001a9eaa;
      }
    }
  }
LAB_001a9fa4:
  if (switch_operands == '\0') {
    set1_00 = &tmp1;
    set2_00 = set2;
  }
  else {
    set2_00 = &tmp1;
    set1_00 = set2;
  }
  LVar4 = moveto_op_comp(set1_00,set2_00,op,result);
LAB_001a9fca:
  lyxp_set_free_content(&tmp1);
  return LVar4;
}

Assistant:

static LY_ERR
moveto_op_comp_item(const struct lyxp_set *set1, uint32_t idx1, struct lyxp_set *set2, const char *op,
        ly_bool switch_operands, ly_bool *result)
{
    struct lyxp_set tmp1 = {0};
    LY_ERR rc = LY_SUCCESS;

    assert(set1->type == LYXP_SET_NODE_SET);

    /* cast set1 */
    switch (set2->type) {
    case LYXP_SET_NUMBER:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_NUMBER, idx1);
        break;
    case LYXP_SET_BOOLEAN:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_BOOLEAN, idx1);
        break;
    default:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_STRING, idx1);
        break;
    }
    LY_CHECK_GOTO(rc, cleanup);

    /* canonize set2 */
    LY_CHECK_GOTO(rc = set_comp_canonize(set2, &set1->val.nodes[idx1]), cleanup);

    /* compare recursively and store the result */
    if (switch_operands) {
        LY_CHECK_GOTO(rc = moveto_op_comp(set2, &tmp1, op, result), cleanup);
    } else {
        LY_CHECK_GOTO(rc = moveto_op_comp(&tmp1, set2, op, result), cleanup);
    }

cleanup:
    lyxp_set_free_content(&tmp1);
    return rc;
}